

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O1

int __thiscall ncnn::Gemm::load_param(Gemm *this,ParamDict *pd)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  
  fVar4 = ParamDict::get(pd,0,1.0);
  this->alpha = fVar4;
  fVar4 = ParamDict::get(pd,1,1.0);
  this->beta = fVar4;
  iVar3 = ParamDict::get(pd,2,0);
  this->transA = iVar3;
  iVar3 = ParamDict::get(pd,3,0);
  this->transB = iVar3;
  iVar3 = ParamDict::get(pd,4,0);
  this->constantA = iVar3;
  iVar3 = ParamDict::get(pd,5,0);
  this->constantB = iVar3;
  iVar3 = ParamDict::get(pd,6,0);
  this->constantC = iVar3;
  iVar3 = ParamDict::get(pd,7,0);
  this->constantM = iVar3;
  iVar3 = ParamDict::get(pd,8,0);
  this->constantN = iVar3;
  iVar3 = ParamDict::get(pd,9,0);
  this->constantK = iVar3;
  iVar3 = ParamDict::get(pd,10,0);
  this->constant_broadcast_type_C = iVar3;
  iVar3 = ParamDict::get(pd,0xb,0);
  this->output_N1M = iVar3;
  iVar3 = ParamDict::get(pd,0xc,0);
  this->output_elempack = iVar3;
  iVar3 = ParamDict::get(pd,0xd,0);
  this->output_elemtype = iVar3;
  iVar3 = ParamDict::get(pd,0xe,0);
  this->output_transpose = iVar3;
  iVar3 = ParamDict::get(pd,0x12,0);
  this->int8_scale_term = iVar3;
  iVar3 = ParamDict::get(pd,0x14,0);
  this->constant_TILE_M = iVar3;
  iVar3 = ParamDict::get(pd,0x15,0);
  this->constant_TILE_N = iVar3;
  iVar3 = ParamDict::get(pd,0x16,0);
  this->constant_TILE_K = iVar3;
  iVar3 = this->constantA;
  if ((iVar3 == 1) && ((this->constantM == 0 || (this->constantK == 0)))) {
    load_param();
  }
  else {
    iVar1 = this->constantB;
    if ((iVar1 == 1) && ((this->constantN == 0 || (this->constantK == 0)))) {
      load_param();
    }
    else {
      uVar2 = this->constantC;
      if ((uVar2 != 1) || (0xfffffff9 < this->constant_broadcast_type_C - 5U)) {
        if ((iVar1 == 1 && iVar3 == 0) && (uVar2 ^ 1) == 0) {
          (this->super_Layer).one_blob_only = true;
        }
        if ((iVar3 == 1 && iVar1 == 0) && (uVar2 ^ 1) == 0) {
          (this->super_Layer).one_blob_only = true;
        }
        if (iVar3 != 1) {
          return 0;
        }
        if (iVar1 != 1) {
          return 0;
        }
        if (uVar2 != 0) {
          return 0;
        }
        (this->super_Layer).one_blob_only = true;
        return 0;
      }
      load_param();
    }
  }
  return -1;
}

Assistant:

int Gemm::load_param(const ParamDict& pd)
{
    alpha = pd.get(0, 1.f);
    beta = pd.get(1, 1.f);
    transA = pd.get(2, 0);
    transB = pd.get(3, 0);
    constantA = pd.get(4, 0);
    constantB = pd.get(5, 0);
    constantC = pd.get(6, 0);
    constantM = pd.get(7, 0);
    constantN = pd.get(8, 0);
    constantK = pd.get(9, 0);
    constant_broadcast_type_C = pd.get(10, 0);
    output_N1M = pd.get(11, 0);
    output_elempack = pd.get(12, 0);
    output_elemtype = pd.get(13, 0);
    output_transpose = pd.get(14, 0);
    int8_scale_term = pd.get(18, 0);
    constant_TILE_M = pd.get(20, 0);
    constant_TILE_N = pd.get(21, 0);
    constant_TILE_K = pd.get(22, 0);

    if (int8_scale_term)
    {
#if !NCNN_INT8
        NCNN_LOGE("please build ncnn with NCNN_INT8 enabled for int8 inference");
        return -1;
#endif
    }

    if (constantA == 1 && (constantM == 0 || constantK == 0))
    {
        NCNN_LOGE("constantM and constantK must be non-zero when constantA enabled");
        return -1;
    }

    if (constantB == 1 && (constantN == 0 || constantK == 0))
    {
        NCNN_LOGE("constantN and constantK must be non-zero when constantB enabled");
        return -1;
    }

    if (constantC == 1 && (constant_broadcast_type_C < -1 || constant_broadcast_type_C > 4))
    {
        NCNN_LOGE("constant_broadcast_type_C must be -1 or 0~4 when constantC enabled");
        return -1;
    }

    if (constantA == 0 && constantB == 1 && constantC == 1)
        one_blob_only = true;

    if (constantA == 1 && constantB == 0 && constantC == 1)
        one_blob_only = true;

    if (constantA == 1 && constantB == 1 && constantC == 0)
        one_blob_only = true;

    return 0;
}